

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_ext_gstate.c
# Opt level: O0

HPDF_BOOL HPDF_ExtGState_Validate(HPDF_ExtGState ext_gstate)

{
  HPDF_ExtGState ext_gstate_local;
  
  if ((ext_gstate == (HPDF_ExtGState)0x0) ||
     (((ext_gstate->header).obj_class != 0xa11 && ((ext_gstate->header).obj_class != 0xb11)))) {
    ext_gstate_local._4_4_ = 0;
  }
  else {
    ext_gstate_local._4_4_ = 1;
  }
  return ext_gstate_local._4_4_;
}

Assistant:

HPDF_BOOL
HPDF_ExtGState_Validate  (HPDF_ExtGState  ext_gstate)
{
    if (!ext_gstate || (ext_gstate->header.obj_class != 
                (HPDF_OSUBCLASS_EXT_GSTATE | HPDF_OCLASS_DICT) &&
                ext_gstate->header.obj_class !=
                 (HPDF_OSUBCLASS_EXT_GSTATE_R | HPDF_OCLASS_DICT)))
        return HPDF_FALSE;

    return HPDF_TRUE;
}